

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

ecs_entity_t *
ecs_bulk_new_w_data(ecs_world_t *world,int32_t count,ecs_entities_t *components,void *data)

{
  _Bool _Var1;
  ecs_stage_t *stage;
  ecs_type_t type;
  ecs_table_t *table;
  ecs_entity_t **ids_out;
  ecs_entity_t *ids;
  ecs_world_t *local_38;
  ecs_entity_t *local_30;
  
  local_38 = world;
  stage = ecs_get_stage(&local_38);
  ids_out = &local_30;
  _Var1 = ecs_defer_bulk_new(local_38,stage,count,components,(void **)data,ids_out);
  if (!_Var1) {
    type = ecs_type_find(local_38,components->array,components->count);
    table = ecs_table_from_type(local_38,type);
    local_30 = new_w_data(local_38,table,(ecs_entities_t *)(ulong)(uint)count,(int32_t)data,
                          (void **)0x0,(int32_t *)ids_out);
    ecs_defer_flush(local_38,stage);
  }
  return local_30;
}

Assistant:

const ecs_entity_t* ecs_bulk_new_w_data(
    ecs_world_t *world,
    int32_t count,
    ecs_entities_t * components,
    void * data)
{
    ecs_stage_t *stage = ecs_get_stage(&world);
    const ecs_entity_t *ids;
    if (ecs_defer_bulk_new(world, stage, count, components, data, &ids)) {
        return ids;
    }
    ecs_type_t type = ecs_type_find(world, components->array, components->count);
    ecs_table_t *table = ecs_table_from_type(world, type);    
    ids = new_w_data(world, table, NULL, count, data, NULL);
    ecs_defer_flush(world, stage);
    return ids;
}